

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDARcheck3(IDAMem IDA_mem)

{
  double dVar1;
  int iVar2;
  long in_RDI;
  int retval;
  int ier;
  int i;
  N_Vector in_stack_00000020;
  N_Vector in_stack_00000028;
  sunrealtype in_stack_00000030;
  IDAMem in_stack_00000038;
  undefined8 local_28;
  int local_14;
  int local_4;
  
  if (*(int *)(in_RDI + 0x490) == 2) {
    *(undefined8 *)(in_RDI + 0x458) = *(undefined8 *)(in_RDI + 0x2a8);
  }
  if (*(int *)(in_RDI + 0x490) == 1) {
    if ((*(double *)(in_RDI + 0x480) - *(double *)(in_RDI + 0x2a8)) * *(double *)(in_RDI + 0x290) <
        0.0) {
      local_28 = *(undefined8 *)(in_RDI + 0x480);
    }
    else {
      local_28 = *(undefined8 *)(in_RDI + 0x2a8);
    }
    *(undefined8 *)(in_RDI + 0x458) = local_28;
  }
  IDAGetSolution(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  iVar2 = (**(code **)(in_RDI + 0x430))
                    (*(undefined8 *)(in_RDI + 0x458),*(undefined8 *)(in_RDI + 0x188),
                     *(undefined8 *)(in_RDI + 400),*(undefined8 *)(in_RDI + 0x470),
                     *(undefined8 *)(in_RDI + 0x18));
  *(long *)(in_RDI + 0x498) = *(long *)(in_RDI + 0x498) + 1;
  if (iVar2 == 0) {
    *(double *)(in_RDI + 0x488) =
         (ABS(*(double *)(in_RDI + 0x2a8)) + ABS(*(double *)(in_RDI + 0x290))) *
         *(double *)(in_RDI + 8) * 100.0;
    iVar2 = IDARootfind(in_stack_00000038);
    if (iVar2 == -10) {
      local_4 = -10;
    }
    else {
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
        if ((*(int *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) == 0) &&
           ((dVar1 = *(double *)(*(long *)(in_RDI + 0x478) + (long)local_14 * 8), dVar1 != 0.0 ||
            (NAN(dVar1))))) {
          *(undefined4 *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) = 1;
        }
      }
      *(undefined8 *)(in_RDI + 0x450) = *(undefined8 *)(in_RDI + 0x460);
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x468) + (long)local_14 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x478) + (long)local_14 * 8);
      }
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        IDAGetSolution(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = -10;
  }
  return local_4;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}